

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void cs_impl::fiber::yield(void)

{
  int iVar1;
  undefined8 *puVar2;
  ulong in_RAX;
  long lVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  char stack_bottom;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  lVar3 = ordinator();
  iVar1 = *(int *)(lVar3 + 0x30);
  plVar4 = (long *)ordinator();
  puVar2 = *(undefined8 **)(*plVar4 + (ulong)(iVar1 - 1) * 8);
  if (puVar2 == (undefined8 *)0x0) {
    __assert_fail("routine != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                  ,0x188,"void cs_impl::fiber::yield()");
  }
  lVar3 = puVar2[0xc];
  lVar5 = ordinator();
  lVar5 = *(long *)(lVar5 + 0x38);
  uStack_18 = uStack_18 & 0xffffffffffffff;
  lVar6 = ordinator();
  if ((ulong)((lVar3 + lVar5) - ((long)&uStack_18 + 7)) <= *(ulong *)(lVar6 + 0x38)) {
    **(undefined8 **)(*(long *)(*(long *)puVar2[7] + 0x10) + 0x110) = 0;
    cs::current_process = (undefined *)*puVar2;
    lVar3 = ordinator();
    *(undefined4 *)(lVar3 + 0x30) = 0;
    lVar3 = ordinator();
    swapcontext(puVar2 + 0xe,lVar3 + 0x40);
    return;
  }
  __assert_fail("size_t(stack_top - &stack_bottom) <= ordinator.stack_size",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                ,0x18c,"void cs_impl::fiber::yield()");
}

Assistant:

void yield()
		{
			routine_t id = ordinator.current;
			Routine *routine = ordinator.routines[id - 1];
			assert(routine != nullptr);

			char *stack_top = routine->stack + ordinator.stack_size;
			char stack_bottom = 0;
			assert(size_t(stack_top - &stack_bottom) <= ordinator.stack_size);

			routine->cs_context->instance->swap_context(nullptr);
			cs::current_process = routine->this_context;

			ordinator.current = 0;
			cs_fiber_swapcontext(&routine->ctx, &ordinator.ctx);
		}